

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_compute_nanomips_pbalrsc_branch(DisasContext_conflict6 *ctx,int rs,int rt)

{
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *pTVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uint32_t uVar3;
  uintptr_t o;
  TCGv_i64 pTVar4;
  ulong a2;
  TCGOpcode opc;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o_3;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (rs == 0) {
    opc = INDEX_op_movi_i64;
    pTVar4 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[rs] == ret) goto LAB_0099ea64;
    pTVar4 = s->cpu_gpr[rs] + (long)s;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_mips64el(s,opc,(TCGArg)a1,(TCGArg)pTVar4);
LAB_0099ea64:
  if (rt != 0) {
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rt]),
               (ctx->base).pc_next + 4);
  }
  tcg_gen_shli_i64_mips64el(s,ret,ret,1);
  tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_00,(ctx->base).pc_next + 4);
  pTVar4 = s->btarget;
  pTVar1 = ctx->uc->tcg_ctx;
  tcg_gen_op3_mips64el
            (pTVar1,INDEX_op_add_i64,(TCGArg)(pTVar4 + (long)&pTVar1->pool_cur),
             (long)pTVar1 + ((long)a1_00 - (long)s),(TCGArg)(ret + (long)pTVar1));
  if ((ctx->hflags & 0x200) != 0) {
    tcg_gen_ext32s_i64_mips64el(pTVar1,pTVar4,pTVar4);
  }
  pTVar1 = ctx->uc->tcg_ctx;
  a2 = (long)(int)ctx->hflags & 0xffffffffff7807ff;
  uVar3 = (uint32_t)a2;
  ctx->hflags = uVar3;
  if ((ctx->base).is_jmp == DISAS_NEXT) {
    if (uVar3 != ctx->saved_hflags) {
      tcg_gen_op2_mips64el(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->hflags + (long)pTVar1),a2);
      ctx->saved_hflags = ctx->hflags;
      uVar2 = ctx->hflags & 0x803800;
      if (((uVar2 == 0x800) || (uVar2 == 0x1800)) || (uVar2 == 0x1000)) {
        tcg_gen_op2_mips64el
                  (pTVar1,INDEX_op_movi_i64,(TCGArg)(pTVar1->btarget + (long)pTVar1),ctx->btarget);
      }
    }
  }
  else {
    tcg_gen_andi_i32_mips64el(pTVar1,pTVar1->hflags,pTVar1->hflags,-0x87f801);
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  if (s->cpu_pc != s->btarget) {
    tcg_gen_op2_mips64el
              (s,INDEX_op_mov_i64,(TCGArg)(s->cpu_pc + (long)s),(TCGArg)(s->btarget + (long)s));
  }
  tcg_gen_lookup_and_goto_ptr_mips64el(s);
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(((long)a1_00 - (long)s) + (long)s));
  return;
}

Assistant:

static void gen_compute_nanomips_pbalrsc_branch(DisasContext *ctx, int rs,
                                                int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    /* load rs */
    gen_load_gpr(tcg_ctx, t0, rs);

    /* link */
    if (rt != 0) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], ctx->base.pc_next + 4);
    }

    /* calculate btarget */
    tcg_gen_shli_tl(tcg_ctx, t0, t0, 1);
    tcg_gen_movi_tl(tcg_ctx, t1, ctx->base.pc_next + 4);
    gen_op_addr_add(ctx, tcg_ctx->btarget, t1, t0);

    /* branch completion */
    clear_branch_hflags(ctx);
    ctx->base.is_jmp = DISAS_NORETURN;

    /* unconditional branch to register */
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->btarget);
    tcg_gen_lookup_and_goto_ptr(tcg_ctx);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}